

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O0

Aig_Man_t * Cgt_ClockGating(Aig_Man_t *pAig,Aig_Man_t *pCare,Cgt_Par_t *pPars)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint local_34;
  Vec_Vec_t *pVStack_30;
  int nNodesUsed;
  Vec_Vec_t *vGates;
  Aig_Man_t *pGated;
  Cgt_Par_t *pPars_local;
  Aig_Man_t *pCare_local;
  Aig_Man_t *pAig_local;
  
  pGated = (Aig_Man_t *)pPars;
  pPars_local = (Cgt_Par_t *)pCare;
  pCare_local = pAig;
  pVStack_30 = Cgt_ClockGatingInt(pAig,pCare,pPars,(Vec_Int_t *)0x0);
  vGates = (Vec_Vec_t *)
           Cgt_ManDeriveGatedAig(pCare_local,pVStack_30,*(int *)&pGated->vCos,(int *)&local_34);
  if (*(int *)((long)&pGated->vCos + 4) != 0) {
    uVar1 = Aig_ManNodeNum(pCare_local);
    iVar2 = Aig_ManNodeNum(pCare_local);
    uVar3 = Aig_ManNodeNum((Aig_Man_t *)vGates);
    printf("Nodes: Before CG = %6d. After CG = %6d. (%6.2f %%).  Total after CG = %6d.\n",
           ((double)(int)local_34 * 100.0) / (double)iVar2,(ulong)uVar1,(ulong)local_34,(ulong)uVar3
          );
  }
  Vec_VecFree(pVStack_30);
  return (Aig_Man_t *)vGates;
}

Assistant:

Aig_Man_t * Cgt_ClockGating( Aig_Man_t * pAig, Aig_Man_t * pCare, Cgt_Par_t * pPars )
{
    Aig_Man_t * pGated;
    Vec_Vec_t * vGates = Cgt_ClockGatingInt( pAig, pCare, pPars, NULL );
    int nNodesUsed;
    if ( pPars->fVerbose )
    {
//        printf( "Before CG: " );
//        Aig_ManPrintStats( pAig );
    }
    pGated = Cgt_ManDeriveGatedAig( pAig, vGates, pPars->fAreaOnly, &nNodesUsed );
    if ( pPars->fVerbose )
    {
//        printf( "After  CG: " );
//        Aig_ManPrintStats( pGated );
        printf( "Nodes: Before CG = %6d. After CG = %6d. (%6.2f %%).  Total after CG = %6d.\n", 
            Aig_ManNodeNum(pAig), nNodesUsed, 
            100.0*nNodesUsed/Aig_ManNodeNum(pAig), 
            Aig_ManNodeNum(pGated) );
    }
    Vec_VecFree( vGates );
    return pGated;
}